

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRoots.cpp
# Opt level: O1

void sort(int nx,double *x)

{
  double dVar1;
  double __tmp;
  
  if (nx == 3) {
    dVar1 = *x;
    if (x[1] < dVar1) {
      *x = x[1];
      x[1] = dVar1;
    }
    dVar1 = x[1];
    if (x[2] < dVar1) {
      x[1] = x[2];
      x[2] = dVar1;
    }
    dVar1 = *x;
    if (x[1] < dVar1) {
      *x = x[1];
      x[1] = dVar1;
    }
  }
  else if (nx == 2) {
    dVar1 = *x;
    if (x[1] < dVar1) {
      *x = x[1];
      x[1] = dVar1;
    }
  }
  return;
}

Assistant:

void
sort (int nx, double x[])
{
    if (nx == 2)
    {
        if (x[0] > x[1]) swap (x[0], x[1]);
    }

    if (nx == 3)
    {
        if (x[0] > x[1]) swap (x[0], x[1]);
        if (x[1] > x[2]) swap (x[1], x[2]);
        if (x[0] > x[1]) swap (x[0], x[1]);
    }
}